

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::
fatal_usage<char_const(&)[102],unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_int_const&>
          (Reporter *this,char (*args) [102],uint *args_1,uint *args_2,uint *args_3,uint *args_4,
          uint *args_5)

{
  format_string<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_const_unsigned_int_&> fmt;
  size_t sVar1;
  undefined8 uVar2;
  uint *in_RCX;
  ostream *in_RDX;
  uint *in_RSI;
  size_t in_RDI;
  uint *in_R8;
  uint *in_R9;
  FatalError *in_stack_00000008;
  ReturnCode returnCode;
  FatalError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  ostream *in_stack_ffffffffffffff10;
  basic_string_view<char> in_stack_ffffffffffffff18;
  char *local_d8 [2];
  uint local_c8 [4];
  char *local_b8;
  size_t local_b0;
  uint *args_3_00;
  uint *args_4_00;
  
  local_b8 = "{} fatal: ";
  local_b0 = std::char_traits<char>::length((char_type *)0x22b03d);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff10,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff08);
  args_3_00 = local_c8;
  args_4_00 = in_RSI;
  local_c8._8_8_ = std::char_traits<char>::length((char_type *)0x22b0db);
  fmt.str_.size_ = in_RDI;
  fmt.str_.data_ = (char *)in_RSI;
  ::fmt::v10::print<unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_int_const&>
            (in_RDX,fmt,in_RCX,in_R8,in_R9,args_3_00,args_4_00);
  returnCode = (ReturnCode)((ulong)in_R9 >> 0x20);
  args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  local_d8[0] = " See \'{} --help\'.\n";
  sVar1 = std::char_traits<char>::length((char_type *)0x22b19e);
  this_00 = in_stack_00000008;
  args_00->_M_string_length = sVar1;
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff10,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff18,args_00);
  uVar2 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(this_00,returnCode);
  __cxa_throw(uVar2,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal_usage(Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, " See '{} --help'.\n", commandName);
        throw FatalError(rc::INVALID_ARGUMENTS);
    }